

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

bool __thiscall
FNodeBuilder::ShoveSegBehind(FNodeBuilder *this,DWORD set,node_t *node,DWORD seg,DWORD mate)

{
  int iVar1;
  FPrivSeg *pFVar2;
  DWORD mate_local;
  DWORD seg_local;
  node_t *node_local;
  DWORD set_local;
  FNodeBuilder *this_local;
  
  pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                     (&this->Segs,(ulong)seg);
  SetNodeFromSeg(this,node,pFVar2);
  this->HackSeg = seg;
  this->HackMate = mate;
  pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                     (&this->Segs,(ulong)seg);
  if ((pFVar2->planefront & 1U) == 0) {
    node->x = node->dx + node->x;
    node->y = node->dy + node->y;
    node->dx = -node->dx;
    node->dy = -node->dy;
  }
  iVar1 = Heuristic(this,node,set,false);
  return 0 < iVar1;
}

Assistant:

bool FNodeBuilder::ShoveSegBehind (DWORD set, node_t &node, DWORD seg, DWORD mate)
{
	SetNodeFromSeg (node, &Segs[seg]);
	HackSeg = seg;
	HackMate = mate;
	if (!Segs[seg].planefront)
	{
		node.x += node.dx;
		node.y += node.dy;
		node.dx = -node.dx;
		node.dy = -node.dy;
	}
	return Heuristic (node, set, false) > 0;
}